

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

optional<UniValue> *
InterpretValue(optional<UniValue> *__return_storage_ptr__,KeyInfo *key,string *value,uint flags,
              string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view str;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (key->negated == true) {
    if ((flags & 0x20) == 0) {
      if ((value != (string *)0x0) && (value->_M_string_length != 0)) {
        str._M_str = (value->_M_dataplus)._M_p;
        str._M_len = value->_M_string_length;
        iVar3 = LocaleIndependentAtoi<int>(str);
        if (iVar3 == 0) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
          ;
          source_file._M_len = 0x5f;
          logging_function._M_str = "InterpretValue";
          logging_function._M_len = 0xe;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function,source_file,0x76,ALL,Info,(ConstevalFormatString<2U>)0x1102de1
                     ,&key->name,value);
          local_48._M_dataplus._M_p._0_1_ = 1;
          UniValue::UniValue<bool,_bool,_true>((UniValue *)__return_storage_ptr__,(bool *)&local_48)
          ;
          (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_engaged = true;
          goto LAB_00d19b66;
        }
      }
      local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffffffffff00;
      UniValue::UniValue<bool,_bool,_true>((UniValue *)__return_storage_ptr__,(bool *)&local_48);
      (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_engaged = true;
    }
    else {
      InterpretValue();
    }
  }
  else if ((flags & 0x40) == 0 || value != (string *)0x0) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    if (value == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    }
    else {
      pcVar2 = (value->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + value->_M_string_length);
    }
    UniValue::
    UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)__return_storage_ptr__,&local_48);
    (__return_storage_ptr__->super__Optional_base<UniValue,_false,_false>)._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_engaged = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    InterpretValue();
  }
LAB_00d19b66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<common::SettingsValue> InterpretValue(const KeyInfo& key, const std::string* value,
                                                  unsigned int flags, std::string& error)
{
    // Return negated settings as false values.
    if (key.negated) {
        if (flags & ArgsManager::DISALLOW_NEGATION) {
            error = strprintf("Negating of -%s is meaningless and therefore forbidden", key.name);
            return std::nullopt;
        }
        // Double negatives like -nofoo=0 are supported (but discouraged)
        if (value && !InterpretBool(*value)) {
            LogPrintf("Warning: parsed potentially confusing double-negative -%s=%s\n", key.name, *value);
            return true;
        }
        return false;
    }
    if (!value && (flags & ArgsManager::DISALLOW_ELISION)) {
        error = strprintf("Can not set -%s with no value. Please specify value with -%s=value.", key.name, key.name);
        return std::nullopt;
    }
    return value ? *value : "";
}